

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O3

int __thiscall
FIX::DataDictionary::addXMLComponentFields
          (DataDictionary *this,DOMDocument *pDoc,DOMNode *pNode,string *msgtype,DataDictionary *DD,
          bool componentRequired)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this_00;
  ConfigError *pCVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pDoc_00;
  undefined7 in_register_00000089;
  bool bVar8;
  string name_1;
  string required;
  string name;
  string local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  int local_bc;
  DataDictionary *local_b8;
  string *local_b0;
  DataDictionary *local_a8;
  long *local_a0;
  long *local_98 [2];
  long local_88 [2];
  DOMDocument *local_78;
  long *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined4 local_44;
  long *local_40;
  MsgTypeToField *local_38;
  
  local_44 = (undefined4)CONCAT71(in_register_00000089,componentRequired);
  local_b8 = this;
  local_b0 = msgtype;
  local_a8 = DD;
  local_78 = pDoc;
  (*pNode->_vptr_DOMNode[4])(&local_40,pNode);
  plVar5 = local_40;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_108.field_2;
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"name","");
  cVar2 = (**(code **)(*plVar5 + 0x10))(plVar5,&local_108,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if (cVar2 == '\0') {
    pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
    local_108._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"No name given to component","");
    ConfigError::ConfigError(pCVar6,&local_108);
    __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  std::operator+(&local_e0,"/fix/components/component[@name=\'",&local_68);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_e0);
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar7) {
    local_108.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_108.field_2._8_4_ = (undefined4)plVar5[3];
    local_108.field_2._12_4_ = *(undefined4 *)((long)plVar5 + 0x1c);
    local_108._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_108.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_108._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_108._M_string_length = plVar5[1];
  *plVar5 = (long)paVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  (*local_78->_vptr_DOMDocument[5])(&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  if (local_70 != (long *)0x0) {
    (**(code **)(*local_70 + 0x10))(&local_e8);
    if (local_e8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      local_bc = 0;
    }
    else {
      local_38 = &local_b8->m_requiredFields;
      local_bc = 0;
      do {
        (**(code **)(local_e8->_M_allocated_capacity + 0x28))(&local_108);
        iVar3 = std::__cxx11::string::compare((char *)&local_108);
        if (iVar3 == 0) {
          bVar8 = true;
        }
        else {
          (**(code **)(local_e8->_M_allocated_capacity + 0x28))(&local_e0);
          iVar3 = std::__cxx11::string::compare((char *)&local_e0);
          bVar8 = iVar3 == 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,
                            CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                     local_e0.field_2._M_local_buf[0]) + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if (bVar8) {
          (**(code **)(local_e8->_M_allocated_capacity + 0x20))(&local_a0);
          plVar5 = local_a0;
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          local_108._M_string_length = 0;
          local_108.field_2._M_allocated_capacity =
               local_108.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"name","");
          pDoc_00 = &local_e0;
          cVar2 = (**(code **)(*plVar5 + 0x10))(plVar5,&local_e0,&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            pDoc_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                local_e0.field_2._M_local_buf[0]) + 1);
            operator_delete(local_e0._M_dataplus._M_p,(ulong)pDoc_00);
          }
          if (cVar2 == '\0') {
            pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e0,"No name given to field","");
            ConfigError::ConfigError(pCVar6,&local_e0);
            __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
          }
          iVar3 = lookupXMLFieldNumber(local_b8,(DOMDocument *)pDoc_00,&local_108);
          plVar5 = local_a0;
          if (local_bc == 0) {
            local_bc = iVar3;
          }
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          local_e0._M_string_length = 0;
          local_e0.field_2._M_local_buf[0] = '\0';
          local_98[0] = local_88;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"required","");
          cVar2 = (**(code **)(*plVar5 + 0x10))(plVar5,(string *)local_98,&local_e0);
          if ((cVar2 == '\0') ||
             ((iVar4 = std::__cxx11::string::compare((char *)&local_e0), iVar4 != 0 &&
              (iVar4 = std::__cxx11::string::compare((char *)&local_e0), iVar4 != 0)))) {
            if (local_98[0] != local_88) {
              operator_delete(local_98[0],local_88[0] + 1);
            }
          }
          else {
            if (local_98[0] != local_88) {
              operator_delete(local_98[0],local_88[0] + 1);
            }
            if ((char)local_44 != '\0') {
              local_98[0] = (long *)CONCAT44(local_98[0]._4_4_,iVar3);
              this_00 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                        std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                        ::operator[](local_38,local_b0);
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>(this_00,(int *)local_98);
            }
          }
          addField(local_a8,iVar3);
          addMsgField(local_a8,local_b0,iVar3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,
                            CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                     local_e0.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          if (local_a0 != (long *)0x0) {
            (**(code **)(*local_a0 + 8))();
          }
        }
        (**(code **)(local_e8->_M_allocated_capacity + 0x28))(&local_108);
        iVar3 = std::__cxx11::string::compare((char *)&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if (iVar3 == 0) {
          (**(code **)(local_e8->_M_allocated_capacity + 0x20))((string *)local_98);
          plVar5 = local_98[0];
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          local_108._M_string_length = 0;
          local_108.field_2._M_allocated_capacity =
               local_108.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"required","");
          (**(code **)(*plVar5 + 0x10))(plVar5,&local_e0,&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,
                            CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                     local_e0.field_2._M_local_buf[0]) + 1);
          }
          iVar3 = std::__cxx11::string::compare((char *)&local_108);
          if (iVar3 == 0) {
            bVar8 = true;
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&local_108);
            bVar8 = iVar3 == 0;
          }
          addXMLComponentFields
                    (local_b8,local_78,(DOMNode *)&local_e8->_M_allocated_capacity,local_b0,local_a8
                     ,bVar8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          if (local_98[0] != (long *)0x0) {
            (**(code **)(*local_98[0] + 8))();
          }
        }
        (**(code **)(local_e8->_M_allocated_capacity + 0x28))(&local_108);
        iVar3 = std::__cxx11::string::compare((char *)&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if (iVar3 == 0) {
          (**(code **)(local_e8->_M_allocated_capacity + 0x20))((string *)local_98);
          plVar5 = local_98[0];
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          local_108._M_string_length = 0;
          local_108.field_2._M_allocated_capacity =
               local_108.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"required","");
          (**(code **)(*plVar5 + 0x10))(plVar5,&local_e0,&local_108);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,
                            CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                     local_e0.field_2._M_local_buf[0]) + 1);
          }
          iVar3 = std::__cxx11::string::compare((char *)&local_108);
          if (iVar3 == 0) {
            bVar8 = true;
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&local_108);
            bVar8 = iVar3 == 0;
          }
          addXMLGroup(local_b8,local_78,(DOMNode *)&local_e8->_M_allocated_capacity,local_b0,
                      local_a8,bVar8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          if (local_98[0] != (long *)0x0) {
            (**(code **)(*local_98[0] + 8))();
          }
        }
        (**(code **)(local_e8->_M_allocated_capacity + 0x18))(&local_108);
        paVar1 = local_e8;
        local_e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_108._M_dataplus._M_p;
        local_108._M_dataplus._M_p = (pointer)0x0;
        if ((paVar1 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0) &&
           ((**(code **)(paVar1->_M_allocated_capacity + 8))(),
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_108._M_dataplus._M_p !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0)) {
          (**(code **)(*(size_type *)local_108._M_dataplus._M_p + 8))();
        }
      } while (local_e8 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0);
    }
    if (local_70 != (long *)0x0) {
      (**(code **)(*local_70 + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                               local_68.field_2._M_local_buf[0]) + 1);
    }
    if (local_40 != (long *)0x0) {
      (**(code **)(*local_40 + 8))();
    }
    return local_bc;
  }
  pCVar6 = (ConfigError *)__cxa_allocate_exception(0x50);
  std::operator+(&local_108,"Component not found: ",&local_68);
  ConfigError::ConfigError(pCVar6,&local_108);
  __cxa_throw(pCVar6,&ConfigError::typeinfo,FIX::Exception::~Exception);
}

Assistant:

int DataDictionary::addXMLComponentFields(
    DOMDocument *pDoc,
    DOMNode *pNode,
    const std::string &msgtype,
    DataDictionary &DD,
    bool componentRequired) {
  int firstField = 0;

  DOMAttributesPtr attrs = pNode->getAttributes();
  std::string name;
  if (!attrs->get("name", name)) {
    throw ConfigError("No name given to component");
  }

  DOMNodePtr pComponentNode = pDoc->getNode("/fix/components/component[@name='" + name + "']");
  if (pComponentNode.get() == 0) {
    throw ConfigError("Component not found: " + name);
  }

  DOMNodePtr pComponentFieldNode = pComponentNode->getFirstChildNode();
  while (pComponentFieldNode.get()) {
    if (pComponentFieldNode->getName() == "field" || pComponentFieldNode->getName() == "group") {
      DOMAttributesPtr attrs = pComponentFieldNode->getAttributes();
      std::string name;
      if (!attrs->get("name", name)) {
        throw ConfigError("No name given to field");
      }
      int field = lookupXMLFieldNumber(pDoc, name);
      if (firstField == 0) {
        firstField = field;
      }

      std::string required;
      if (attrs->get("required", required) && (required == "Y" || required == "y") && componentRequired) {
        addRequiredField(msgtype, field);
      }

      DD.addField(field);
      DD.addMsgField(msgtype, field);
    }
    if (pComponentFieldNode->getName() == "component") {
      DOMAttributesPtr attrs = pComponentFieldNode->getAttributes();
      std::string required;
      attrs->get("required", required);
      bool isRequired = (required == "Y" || required == "y");
      addXMLComponentFields(pDoc, pComponentFieldNode.get(), msgtype, DD, isRequired);
    }
    if (pComponentFieldNode->getName() == "group") {
      DOMAttributesPtr attrs = pComponentFieldNode->getAttributes();
      std::string required;
      attrs->get("required", required);
      bool isRequired = (required == "Y" || required == "y");
      addXMLGroup(pDoc, pComponentFieldNode.get(), msgtype, DD, isRequired);
    }
    RESET_AUTO_PTR(pComponentFieldNode, pComponentFieldNode->getNextSiblingNode());
  }
  return firstField;
}